

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O0

void __thiscall
TPZDohrMatrix<long_double,_TPZDohrSubstructCondense<long_double>_>::TPZDohrMatrix
          (TPZDohrMatrix<long_double,_TPZDohrSubstructCondense<long_double>_> *this,void **vtt)

{
  undefined8 *in_RSI;
  void **in_RDI;
  TPZMatrix<long_double> *in_stack_ffffffffffffffe0;
  
  *(undefined8 *)((long)in_RDI + 10) = 0;
  *(undefined8 *)((long)in_RDI + 0x12) = 0;
  *in_RDI = (void *)0x0;
  in_RDI[1] = (void *)0x0;
  TPZMatrix<long_double>::TPZMatrix(in_stack_ffffffffffffffe0,in_RDI);
  *in_RDI = (void *)*in_RSI;
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
  ::list((list<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
          *)0x1fd8a91);
  TPZAutoPointer<TPZDohrAssembly<long_double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

TPZDohrMatrix() : TPZMatrix<TVar>()
    {
        
    }